

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

rnnbitfield * parsebitfield(rnndb *db,char *file,xmlNode *node)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  uint64_t uVar5;
  rnnenum **pprVar6;
  xmlNode *local_48;
  xmlNode *chain;
  int lowok;
  int highok;
  xmlAttr *attr;
  rnnbitfield *bf;
  xmlNode *node_local;
  char *file_local;
  rnndb *db_local;
  
  db_local = (rnndb *)calloc(0xe8,1);
  *(char **)&db_local[1].groupsnum = file;
  bVar1 = false;
  bVar2 = false;
  for (_lowok = node->properties; _lowok != (xmlAttr *)0x0; _lowok = _lowok->next) {
    iVar3 = strcmp((char *)_lowok->name,"name");
    if (iVar3 == 0) {
      pcVar4 = getattrib(db,file,(uint)node->line,_lowok);
      pcVar4 = strdup(pcVar4);
      *(char **)&db_local->copyright = pcVar4;
    }
    else {
      iVar3 = strcmp((char *)_lowok->name,"high");
      if (iVar3 == 0) {
        uVar5 = getnumattrib(db,file,(uint)node->line,_lowok);
        *(int *)((long)&(db_local->copyright).license + 4) = (int)uVar5;
        bVar1 = true;
      }
      else {
        iVar3 = strcmp((char *)_lowok->name,"low");
        if (iVar3 == 0) {
          uVar5 = getnumattrib(db,file,(uint)node->line,_lowok);
          *(int *)&(db_local->copyright).license = (int)uVar5;
          bVar2 = true;
        }
        else {
          iVar3 = strcmp((char *)_lowok->name,"pos");
          if (iVar3 == 0) {
            uVar5 = getnumattrib(db,file,(uint)node->line,_lowok);
            *(int *)&(db_local->copyright).license = (int)uVar5;
            *(int *)((long)&(db_local->copyright).license + 4) = (int)uVar5;
            bVar1 = true;
            bVar2 = true;
          }
          else {
            iVar3 = strcmp((char *)_lowok->name,"varset");
            if (iVar3 == 0) {
              pcVar4 = getattrib(db,file,(uint)node->line,_lowok);
              pprVar6 = (rnnenum **)strdup(pcVar4);
              db_local->enums = pprVar6;
            }
            else {
              iVar3 = strcmp((char *)_lowok->name,"variants");
              if (iVar3 == 0) {
                pcVar4 = getattrib(db,file,(uint)node->line,_lowok);
                pcVar4 = strdup(pcVar4);
                *(char **)&db_local->enumsnum = pcVar4;
              }
              else {
                iVar3 = trytypeattr(db,file,node,_lowok,(rnntypeinfo *)&db_local->groupsnum);
                if (iVar3 == 0) {
                  fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for bitfield\n",file,
                          (ulong)node->line,_lowok->name);
                  db->estatus = 1;
                }
              }
            }
          }
        }
      }
    }
  }
  for (local_48 = node->children; local_48 != (xmlNode *)0x0; local_48 = local_48->next) {
    if ((((local_48->type == XML_ELEMENT_NODE) &&
         (iVar3 = trytypetag(db,file,local_48,(rnntypeinfo *)&db_local->groupsnum), iVar3 == 0)) &&
        (iVar3 = trytop(db,file,local_48), iVar3 == 0)) &&
       (iVar3 = trydoc(db,file,local_48), iVar3 == 0)) {
      fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)local_48->line,node->name,
              local_48->name);
      db->estatus = 1;
    }
  }
  if (*(long *)&db_local->copyright == 0) {
    fprintf(_stderr,"%s:%d: nameless bitfield\n",file,(ulong)node->line);
    db->estatus = 1;
    db_local = (rnndb *)0x0;
  }
  else if (((!bVar1) || (!bVar2)) ||
          (*(int *)((long)&(db_local->copyright).license + 4) <
           *(int *)&(db_local->copyright).license)) {
    fprintf(_stderr,"%s:%d: bitfield has wrong placement\n",file,(ulong)node->line);
    db->estatus = 1;
    db_local = (rnndb *)0x0;
  }
  return (rnnbitfield *)db_local;
}

Assistant:

static struct rnnbitfield *parsebitfield(struct rnndb *db, char *file, xmlNode *node) {
	struct rnnbitfield *bf = calloc(sizeof *bf, 1);
	bf->file = file;
	xmlAttr *attr = node->properties;
	int highok = 0, lowok = 0;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			bf->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "high")) {
			bf->high = getnumattrib(db, file, node->line, attr);
			highok = 1;
		} else if (!strcmp(attr->name, "low")) {
			bf->low = getnumattrib(db, file, node->line, attr);
			lowok = 1;
		} else if (!strcmp(attr->name, "pos")) {
			bf->high = bf->low = getnumattrib(db, file, node->line, attr);
			lowok = highok = 1;
		} else if (!strcmp(attr->name, "varset")) {
			bf->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			bf->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!trytypeattr(db, file, node, attr, &bf->typeinfo)) {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for bitfield\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytypetag(db, file, chain, &bf->typeinfo) && !trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
	if (!bf->name) {
		fprintf (stderr, "%s:%d: nameless bitfield\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else if (!highok || !lowok || bf->high < bf->low) {
		fprintf (stderr, "%s:%d: bitfield has wrong placement\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else {
		return bf;
	}
}